

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::iterate
          (MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  initInternals(this);
  (**(code **)(lVar2 + 0x1390))(0x9100,1,0x8058,0x10,0x10,0);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Texture object initialization failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp"
                  ,0x539);
  (**(code **)(lVar2 + 0xab0))(0x9100,0xffffffff,0x8c10,&this->int_data);
  iVar1 = (**(code **)(lVar2 + 0x800))();
  if (iVar1 == 0x501) {
    (**(code **)(lVar2 + 0xaa8))(0x9100,0xffffffff,0x8c10,&this->float_data);
    iVar1 = (**(code **)(lVar2 + 0x800))();
    if (iVar1 == 0x501) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"glGetTexLevelParameterfv() did not generate GL_INVALID_VALUE error.",
               "gl.getError() == GL_INVALID_VALUE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp"
               ,0x547);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"glGetTexLevelParameteriv() did not generate GL_INVALID_VALUE error.",
               "gl.getError() == GL_INVALID_VALUE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetTexLevelParameterifvTests.cpp"
               ,0x540);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Set up texture storage. */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 1, /* samples */
							   GL_RGBA8, 16,				 /* width */
							   16,							 /* height */
							   GL_FALSE);

	/* Check if no error was generated. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture object initialization failed.");

	/* Call glGetTexLevelParameteriv() with negative lod. */
	gl.getTexLevelParameteriv(GL_TEXTURE_2D_MULTISAMPLE, -1 /* negative lod */, GL_TEXTURE_RED_TYPE, &int_data);

	/* Expect GL_INVALID_VALUE error code. */
	TCU_CHECK_MSG(gl.getError() == GL_INVALID_VALUE,
				  "glGetTexLevelParameteriv() did not generate GL_INVALID_VALUE error.");

	/* Call glGetTexLevelParameterfv() with negative lod. */
	gl.getTexLevelParameterfv(GL_TEXTURE_2D_MULTISAMPLE, -1 /* negative lod */, GL_TEXTURE_RED_TYPE, &float_data);

	/* Expect GL_INVALID_VALUE error code. */
	TCU_CHECK_MSG(gl.getError() == GL_INVALID_VALUE,
				  "glGetTexLevelParameterfv() did not generate GL_INVALID_VALUE error.");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}